

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void StdSprintf<unsigned_short>(void)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  unsigned_short i;
  uint uVar6;
  ulong uVar7;
  char *__s;
  char local_78 [8];
  char buf [64];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  __s = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sprintf",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  lVar3 = std::chrono::_V2::steady_clock::now();
  uVar7 = 0;
  do {
    sprintf(local_78,"%hu",uVar7);
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 0xffff);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void StdSprintf()
{
    char buf[64];
    PROFILING_BEGIN(T, "sprintf")
    sprintf(buf, PrintfFormat<T>(), i);
    PROFILING_END()
}